

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# surface_parameterization_quantity.cpp
# Opt level: O2

void __thiscall
polyscope::SurfaceVertexParameterizationQuantity::fillColorBuffers
          (SurfaceVertexParameterizationQuantity *this,ShaderProgram *p)

{
  long lVar1;
  long lVar2;
  long *plVar3;
  long lVar4;
  ulong uVar5;
  ulong uVar6;
  allocator local_89;
  ShaderProgram *local_88;
  ulong local_80;
  long local_78;
  long *local_70;
  vector<glm::vec<2,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<2,_float,_(glm::qualifier)0>_>_>
  coordVal;
  string local_50 [32];
  
  coordVal.
  super__Vector_base<glm::vec<2,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<2,_float,_(glm::qualifier)0>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  coordVal.
  super__Vector_base<glm::vec<2,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<2,_float,_(glm::qualifier)0>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  coordVal.
  super__Vector_base<glm::vec<2,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<2,_float,_(glm::qualifier)0>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  lVar1 = *(long *)&(this->super_SurfaceParameterizationQuantity).field_0x8;
  local_88 = p;
  std::
  vector<glm::vec<2,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<2,_float,_(glm::qualifier)0>_>_>
  ::reserve(&coordVal,*(long *)(lVar1 + 0x2e8) - *(long *)(lVar1 + 0x2e0) >> 3);
  uVar5 = 0;
  while( true ) {
    lVar1 = *(long *)&(this->super_SurfaceParameterizationQuantity).field_0x8;
    lVar2 = *(long *)(lVar1 + 0x2e0);
    if ((ulong)((*(long *)(lVar1 + 0x2e8) - lVar2) / 0x18) <= uVar5) break;
    lVar4 = uVar5 * 0x18;
    plVar3 = *(long **)(lVar2 + lVar4);
    lVar1 = *(long *)(lVar2 + 8 + lVar4);
    local_70 = (long *)(lVar2 + lVar4);
    local_78 = *plVar3 << 3;
    local_80 = uVar5;
    for (uVar6 = 2; uVar6 < (ulong)(lVar1 - (long)plVar3 >> 3); uVar6 = uVar6 + 1) {
      lVar2 = *(long *)(*local_70 + -8 + uVar6 * 8);
      lVar4 = *(long *)(*local_70 + uVar6 * 8);
      std::
      vector<glm::vec<2,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<2,_float,_(glm::qualifier)0>_>_>
      ::push_back(&coordVal,
                  (value_type *)
                  ((long)&((this->coords).
                           super__Vector_base<glm::vec<2,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<2,_float,_(glm::qualifier)0>_>_>
                           ._M_impl.super__Vector_impl_data._M_start)->field_0 + local_78));
      std::
      vector<glm::vec<2,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<2,_float,_(glm::qualifier)0>_>_>
      ::push_back(&coordVal,
                  (this->coords).
                  super__Vector_base<glm::vec<2,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<2,_float,_(glm::qualifier)0>_>_>
                  ._M_impl.super__Vector_impl_data._M_start + lVar2);
      std::
      vector<glm::vec<2,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<2,_float,_(glm::qualifier)0>_>_>
      ::push_back(&coordVal,
                  (this->coords).
                  super__Vector_base<glm::vec<2,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<2,_float,_(glm::qualifier)0>_>_>
                  ._M_impl.super__Vector_impl_data._M_start + lVar4);
    }
    uVar5 = local_80 + 1;
  }
  std::__cxx11::string::string(local_50,"a_value2",&local_89);
  (*local_88->_vptr_ShaderProgram[0xf])(local_88,local_50,&coordVal,0,0,0xffffffffffffffff);
  std::__cxx11::string::~string(local_50);
  std::
  _Vector_base<glm::vec<2,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<2,_float,_(glm::qualifier)0>_>_>
  ::~_Vector_base(&coordVal.
                   super__Vector_base<glm::vec<2,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<2,_float,_(glm::qualifier)0>_>_>
                 );
  return;
}

Assistant:

void SurfaceVertexParameterizationQuantity::fillColorBuffers(render::ShaderProgram& p) {
  std::vector<glm::vec2> coordVal;
  coordVal.reserve(3 * parent.nFacesTriangulation());

  for (size_t iF = 0; iF < parent.nFaces(); iF++) {
    auto& face = parent.faces[iF];
    size_t D = face.size();

    // implicitly triangulate from root
    size_t vRoot = face[0];
    for (size_t j = 1; (j + 1) < D; j++) {
      size_t vB = face[j];
      size_t vC = face[(j + 1) % D];

      coordVal.push_back(coords[vRoot]);
      coordVal.push_back(coords[vB]);
      coordVal.push_back(coords[vC]);
    }
  }

  // Store data in buffers
  p.setAttribute("a_value2", coordVal);
}